

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

bool remove_handler(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                   ValueCallback *callback)

{
  bool bVar1;
  reference ppVVar2;
  iterator local_d8;
  const_iterator local_b8;
  undefined1 local_98 [8];
  iterator it;
  ValueCallback *cb;
  iterator __end1;
  iterator __begin1;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *__range1;
  int found;
  int i;
  ValueCallback *callback_local;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks_local;
  
  __range1._4_4_ = 0;
  __range1._0_4_ = -1;
  std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::begin
            ((iterator *)&__end1._M_node,callbacks);
  std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::end((iterator *)&cb,callbacks);
  do {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&cb);
    if (!bVar1) {
LAB_0011ecac:
      if (-1 < (int)__range1) {
        std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::begin
                  ((iterator *)local_98,callbacks);
        std::advance<std::_Deque_iterator<ValueCallback*,ValueCallback*&,ValueCallback**>,int>
                  ((_Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> *)local_98,
                   (int)__range1);
        std::_Deque_iterator<ValueCallback*,ValueCallback*const&,ValueCallback*const*>::
        _Deque_iterator<std::_Deque_iterator<ValueCallback*,ValueCallback*&,ValueCallback**>,void>
                  ((_Deque_iterator<ValueCallback*,ValueCallback*const&,ValueCallback*const*> *)
                   &local_b8,
                   (_Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> *)local_98)
        ;
        std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::erase
                  (&local_d8,callbacks,&local_b8);
      }
      return -1 < (int)__range1;
    }
    ppVVar2 = std::_Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**>::operator*
                        ((_Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> *)
                         &__end1._M_node);
    it._M_node = (_Map_pointer)*ppVVar2;
    if ((ValueCallback *)it._M_node == callback) {
      __range1._0_4_ = __range1._4_4_;
      goto LAB_0011ecac;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    std::_Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**>::operator++
              ((_Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> *)
               &__end1._M_node);
  } while( true );
}

Assistant:

bool remove_handler(std::deque<ValueCallback*>& callbacks, ValueCallback* callback){
    int i = 0;
    int found = -1;
    for(auto cb : callbacks){
        if(cb == callback){
            found = i;
            break;
        }
        i++;
    }

    if(found > -1){
        auto it = callbacks.begin();
        std::advance(it, found);
        callbacks.erase(it);
        return true;
    } else {
        return false;
    }
}